

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::EOR_ID_X(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t address;
  byte bVar3;
  
  this->cycles = 6;
  bVar1 = GetByte(this);
  address = ReadWord(this,(ushort)this->X + (ushort)bVar1);
  bVar2 = ReadByte(this,address);
  bVar1 = this->A;
  bVar3 = bVar1 ^ bVar2;
  this->A = bVar3;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = bVar3 & 0x80 | (bVar1 == bVar2) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_ID_X()
{
    cycles = 6;
    A ^= ReadByte(ReadWord((uint16_t)(GetByte() + X)));
    cycles--;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}